

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::setRootIndex(QListView *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  QListViewPrivate *pQVar2;
  int *piVar3;
  QModelIndex *in_RSI;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  QListViewPrivate *this_00;
  int local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QListView *)0x87828f);
  local_10[1] = 0;
  pQVar1 = (pQVar2->super_QAbstractItemViewPrivate).model;
  local_10[0] = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,in_RSI);
  local_10[0] = local_10[0] + -1;
  piVar3 = qMin<int>(&pQVar2->column,local_10);
  piVar3 = qMax<int>(local_10 + 1,piVar3);
  pQVar2->column = *piVar3;
  QAbstractItemView::setRootIndex((QAbstractItemView *)this_00,in_RSI);
  QListViewPrivate::clear(in_RDI);
  QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x87831f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::setRootIndex(const QModelIndex &index)
{
    Q_D(QListView);
    d->column = qMax(0, qMin(d->column, d->model->columnCount(index) - 1));
    QAbstractItemView::setRootIndex(index);
    // sometimes we get an update before reset() is called
    d->clear();
    d->hiddenRows.clear();
}